

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

uc_err uc_context_reg_read_batch2(uc_context *ctx,int *regs,void **vals,size_t *sizes,int count)

{
  uc_mode uVar1;
  uc_err uVar2;
  context_reg_rw_t cVar3;
  uc_err err;
  void *value;
  int local_60;
  uint regid;
  int i;
  int mode;
  void *env;
  reg_read_t reg_read;
  int count_local;
  size_t *sizes_local;
  void **vals_local;
  int *regs_local;
  uc_context *ctx_local;
  
  cVar3 = find_context_reg_rw(ctx->arch,ctx->mode);
  env = cVar3.read;
  uVar1 = ctx->mode;
  local_60 = 0;
  while( true ) {
    if (count <= local_60) {
      return UC_ERR_OK;
    }
    uVar2 = (*(code *)env)(&ctx->field_0x14,uVar1,regs[local_60],vals[local_60],sizes + local_60);
    if (uVar2 != UC_ERR_OK) break;
    local_60 = local_60 + 1;
  }
  return uVar2;
}

Assistant:

UNICORN_EXPORT
uc_err uc_context_reg_read_batch2(uc_context *ctx, int *regs, void *const *vals,
                                  size_t *sizes, int count)
{
    reg_read_t reg_read = find_context_reg_rw(ctx->arch, ctx->mode).read;
    void *env = ctx->data;
    int mode = ctx->mode;
    int i;

    for (i = 0; i < count; i++) {
        unsigned int regid = regs[i];
        void *value = vals[i];
        uc_err err = reg_read(env, mode, regid, value, sizes + i);
        if (err) {
            return err;
        }
    }

    return UC_ERR_OK;
}